

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

ON_Material * Internal_SystemMaterialInit(ON_Material *__return_storage_ptr__,int index)

{
  ON_Color *pOVar1;
  ON_UUID id;
  ON_UUID id_00;
  
  ON_Material::ON_Material(__return_storage_ptr__);
  if (index == -1) {
    id_00.Data4[0] = 0x94;
    id_00.Data4[1] = '\x18';
    id_00.Data4[2] = 0xdd;
    id_00.Data4[3] = 0xe9;
    id_00.Data4[4] = '\x1d';
    id_00.Data4[5] = '&';
    id_00.Data4[6] = '`';
    id_00.Data4[7] = 0x86;
    id_00.Data1 = 0xcf2be1de;
    id_00.Data2 = 0xb81c;
    id_00.Data3 = 0x4d69;
    Internal_SystemModelComponentInit
              (id_00,-1,(wchar_t *)0x0,&__return_storage_ptr__->super_ON_ModelComponent);
    pOVar1 = &ON_Color::Gray250;
  }
  else {
    id.Data4[0] = 0x81;
    id.Data4[1] = 0x8a;
    id.Data4[2] = 0x9a;
    id.Data4[3] = '\x15';
    id.Data4[4] = '\v';
    id.Data4[5] = 0xae;
    id.Data4[6] = '1';
    id.Data4[7] = '9';
    id.Data1 = 0x70bd1640;
    id.Data2 = 0xe92d;
    id.Data3 = 0x4fff;
    Internal_SystemModelComponentInit
              (id,-2,(wchar_t *)0x0,&__return_storage_ptr__->super_ON_ModelComponent);
    pOVar1 = &ON_Color::Gray105;
  }
  (__return_storage_ptr__->m_diffuse).field_0 = pOVar1->field_0;
  return __return_storage_ptr__;
}

Assistant:

static ON_Material Internal_SystemMaterialInit(int index)
{
  ON_Material m;
  switch (index)
  {
  case -1: // Default
    {
      // {CF2BE1DE-B81C-4D69-9418-DDE91D266086}
      const ON_UUID id =
      { 0xcf2be1de, 0xb81c, 0x4d69, { 0x94, 0x18, 0xdd, 0xe9, 0x1d, 0x26, 0x60, 0x86 } };
      Internal_SystemModelComponentInit(id, index, nullptr, m);
      m.m_diffuse = ON_Color::Gray250;
    }
    break;

  case -2: // Locked Object Color
    {
      // {70BD1640-E92D-4FFF-818A-9A150BAE3139}
      const ON_UUID id =
      { 0x70bd1640, 0xe92d, 0x4fff, { 0x81, 0x8a, 0x9a, 0x15, 0xb, 0xae, 0x31, 0x39 } };
      Internal_SystemModelComponentInit(id, index, nullptr, m);
      m.m_diffuse = ON_Color::Gray105;
    }
    break;

  default:
    ON_ERROR("Invalid index.");
    break;
  }
  return m;
}